

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

bool __thiscall pbrt::Image::Write(Image *this,string *name,ImageMetadata *metadata)

{
  PixelFormat PVar1;
  bool bVar2;
  int iVar3;
  Bounds2<int> *pBVar4;
  Allocator AVar5;
  RGBColorSpace *this_00;
  ImageMetadata *metadata_00;
  ImageMetadata *metadata_01;
  long lVar6;
  Image *this_01;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_01;
  allocator<char> local_223;
  allocator<char> local_222;
  allocator<char> local_221;
  int vb;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [56];
  ImageChannelDesc desc_1;
  string local_148 [32];
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_128;
  ImageChannelDesc desc;
  Image rgbImage;
  
  if ((metadata->pixelBounds).set == true) {
    pBVar4 = pstd::optional<pbrt::Bounds2<int>_>::value(&metadata->pixelBounds);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pBVar4->pMax).super_Tuple2<pbrt::Point2,_int>;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pBVar4->pMin).super_Tuple2<pbrt::Point2,_int>;
    auVar8 = vpsubd_avx(auVar7,auVar8);
    auVar7 = vpshufd_avx(auVar8,0x55);
    auVar7 = vpmulld_avx(auVar7,auVar8);
    rgbImage.format = auVar7._0_4_;
    vb = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y *
         (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
    if (rgbImage.format != vb) {
      LogFatal<char_const(&)[29],char_const(&)[28],char_const(&)[29],int&,char_const(&)[28],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x378,"Check failed: %s == %s with %s = %s, %s = %s",
                 (char (*) [29])"metadata.pixelBounds->Area()",
                 (char (*) [28])"resolution.x * resolution.y",
                 (char (*) [29])"metadata.pixelBounds->Area()",(int *)&rgbImage,
                 (char (*) [28])"resolution.x * resolution.y",&vb);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rgbImage,"exr",(allocator<char> *)&vb);
  bVar2 = HasExtension(name,(string *)&rgbImage);
  std::__cxx11::string::~string((string *)&rgbImage);
  if (bVar2) {
    bVar2 = WriteEXR(this,name,metadata);
    return bVar2;
  }
  PVar1 = (PixelFormat)(this->channelNames).nStored;
  if (4 < (int)PVar1) {
    rgbImage.format = PVar1;
    Error<std::__cxx11::string&,int>
              ("%s: unable to write an %d channel image in this format.",name,(int *)&rgbImage);
    return false;
  }
  AVar5.memoryResource = pstd::pmr::new_delete_resource();
  Image(&rgbImage,AVar5);
  iVar3 = (int)(this->channelNames).nStored;
  this_01 = this;
  if (iVar3 == 4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"R",(allocator<char> *)&desc_1)
    ;
    std::__cxx11::string::string<std::allocator<char>>(local_200,"G",(allocator<char> *)&local_128);
    std::__cxx11::string::string<std::allocator<char>>(local_1e0,"B",&local_223);
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,"A",&local_222);
    requestedChannels.n = 4;
    requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb
    ;
    GetChannelDesc(&desc,this,requestedChannels);
    lVar6 = 0x60;
    do {
      std::__cxx11::string::~string((string *)((long)&vb + lVar6));
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x20);
    if (desc.offset.nStored == 0) {
      Error<std::__cxx11::string&>("%s: unable to write an 4 channel image that is not RGBA.",name);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&desc_1,"R",&local_223);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&desc_1.offset.nAlloc,"G",&local_222);
      std::__cxx11::string::string<std::allocator<char>>(local_148,"B",&local_221);
      requestedChannels_00.n = 3;
      requestedChannels_00.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc_1;
      GetChannelDesc((ImageChannelDesc *)&local_128,this,requestedChannels_00);
      AVar5.memoryResource = pstd::pmr::new_delete_resource();
      SelectChannels((Image *)&vb,this,(ImageChannelDesc *)&local_128,AVar5);
      this_01 = &rgbImage;
      operator=(this_01,(Image *)&vb);
      ~Image((Image *)&vb);
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&local_128);
      lVar6 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&desc_1.offset.alloc.memoryResource + lVar6))
        ;
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x20);
    }
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&desc.offset);
    if (desc.offset.nStored != 0) {
      iVar3 = (int)(this->channelNames).nStored;
      goto LAB_00271f93;
    }
  }
  else {
LAB_00271f93:
    if (iVar3 == 3) {
      this_00 = ImageMetadata::GetColorSpace(metadata);
      bVar2 = RGBColorSpace::operator!=(this_00,RGBColorSpace::sRGB);
      if (bVar2) {
        Warning<std::__cxx11::string&>
                  ("%s: writing image with non-sRGB color space to a format that doesn\'t store color spaces."
                   ,name);
      }
    }
    if ((int)(this->channelNames).nStored == 3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"R",(allocator<char> *)&desc)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                (local_200,"G",(allocator<char> *)&local_128);
      std::__cxx11::string::string<std::allocator<char>>(local_1e0,"B",&local_223);
      requestedChannels_01.n = 3;
      requestedChannels_01.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
      GetChannelDesc(&desc_1,this,requestedChannels_01);
      lVar6 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&vb + lVar6));
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x20);
      if (desc_1.offset.nStored == 0) {
        Warning<std::__cxx11::string&>
                  ("%s: 3-channels but doesn\'t have R, G, and B. Image may be garbled.",name);
      }
      else {
        AVar5.memoryResource = pstd::pmr::new_delete_resource();
        SelectChannels((Image *)&vb,this,&desc_1,AVar5);
        this_01 = &rgbImage;
        operator=(this_01,(Image *)&vb);
        ~Image((Image *)&vb);
      }
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&desc_1.offset);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vb,"pfm",(allocator<char> *)&desc_1);
    bVar2 = HasExtension(name,(string *)&vb);
    std::__cxx11::string::~string((string *)&vb);
    if (bVar2) {
      bVar2 = WritePFM(this_01,name,metadata_00);
      goto LAB_00272155;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vb,"png",(allocator<char> *)&desc_1);
    bVar2 = HasExtension(name,(string *)&vb);
    std::__cxx11::string::~string((string *)&vb);
    if (bVar2) {
      bVar2 = WritePNG(this_01,name,metadata_01);
      goto LAB_00272155;
    }
    Error<std::__cxx11::string&>("%s: no support for writing images with this extension",name);
  }
  bVar2 = false;
LAB_00272155:
  ~Image(&rgbImage);
  return bVar2;
}

Assistant:

bool Image::Write(std::string name, const ImageMetadata &metadata) const {
    if (metadata.pixelBounds)
        CHECK_EQ(metadata.pixelBounds->Area(), resolution.x * resolution.y);

    if (HasExtension(name, "exr"))
        return WriteEXR(name, metadata);

    if (NChannels() > 4) {
        Error("%s: unable to write an %d channel image in this format.", name,
              NChannels());
        return false;
    }

    const Image *image = this;
    Image rgbImage;
    if (NChannels() == 4) {
        ImageChannelDesc desc = GetChannelDesc({"R", "G", "B", "A"});
        if (desc) {
            rgbImage = SelectChannels(GetChannelDesc({"R", "G", "B"}));
            image = &rgbImage;
        } else {
            Error("%s: unable to write an 4 channel image that is not RGBA.", name);
            return false;
        }
    }
    if (NChannels() == 3 && *metadata.GetColorSpace() != *RGBColorSpace::sRGB)
        Warning("%s: writing image with non-sRGB color space to a format that "
                "doesn't store color spaces.",
                name);

    if (NChannels() == 3) {
        // Order as RGB
        ImageChannelDesc desc = GetChannelDesc({"R", "G", "B"});
        if (!desc)
            Warning("%s: 3-channels but doesn't have R, G, and B. "
                    "Image may be garbled.",
                    name);
        else {
            rgbImage = SelectChannels(desc);
            image = &rgbImage;
        }
    }

    if (HasExtension(name, "pfm"))
        return image->WritePFM(name, metadata);
    else if (HasExtension(name, "png"))
        return image->WritePNG(name, metadata);
    else {
        Error("%s: no support for writing images with this extension", name);
        return false;
    }
}